

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChildKiller_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::KillChildren::
act<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (KillChildren *this,AVisitor<hiberlite::KillChildren> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  KillChildren *pKVar1;
  AVisitor<hiberlite::KillChildren> *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_value;
  _Elt_pointer plVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  vector<long_long,_std::allocator<long_long>_> children;
  string tab;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  allocator local_1f2;
  allocator local_1f1;
  KillChildren *local_1f0;
  AVisitor<hiberlite::KillChildren> *local_1e8;
  long local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  shared_connection local_1d0;
  shared_connection local_1c0;
  _Vector_base<long_long,_std::allocator<long_long>_> local_1b0;
  string local_198 [32];
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Scope local_f8;
  string local_b0;
  string local_90;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_70
  ;
  
  local_1f0 = this;
  std::__cxx11::string::string((string *)&local_118,(string *)nvp);
  AVisitor<hiberlite::KillChildren>::diveTable(av,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  Scope::Scope(&local_f8,&av->scope);
  std::__cxx11::string::string(local_198,(string *)&local_f8);
  Scope::~Scope(&local_f8);
  local_1c0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1c0.res = (av->rootKey).con.res;
  if (local_1c0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1c0.res)->refCount = (local_1c0.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_138,local_198);
  plVar3 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar3 == (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    plVar3 = (local_1f0->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_1e8 = av;
  Database::dbSelectChildIds
            ((vector<long_long,_std::allocator<long_long>_> *)&local_1b0,&local_1c0,&local_138,
             plVar3[-1]);
  std::__cxx11::string::~string((string *)&local_138);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1c0);
  local_1e0 = 0;
  for (uVar4 = 0; pAVar2 = local_1e8,
      uVar4 < (ulong)((long)local_1b0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1b0._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = uVar4 + 1) {
    access::construct<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string>
              (local_1e8,&local_1d8);
    std::deque<long_long,_std::allocator<long_long>_>::push_back
              ((deque<long_long,_std::allocator<long_long>_> *)local_1f0,
               (value_type_conflict4 *)
               ((long)local_1b0._M_impl.super__Vector_impl_data._M_start + local_1e0));
    std::__cxx11::string::string((string *)&local_90,"item",&local_1f1);
    _value = local_1d8;
    std::__cxx11::string::string((string *)&local_b0,"",&local_1f2);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_f8,&local_90,_value,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    sql_nvp(&local_70,
            (sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_f8);
    AVisitor<hiberlite::KillChildren>::operator&(local_1e8,&local_70);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp(&local_70);
    pKVar1 = local_1f0;
    std::deque<long_long,_std::allocator<long_long>_>::pop_back
              ((deque<long_long,_std::allocator<long_long>_> *)local_1f0);
    access::destroy<hiberlite::KillChildren,std::__cxx11::string>(pKVar1,local_1d8);
    sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f8);
    local_1e0 = local_1e0 + 8;
  }
  AVisitor<hiberlite::KillChildren>::popScope(local_1e8);
  local_1d0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_1d0.res = (pAVar2->rootKey).con.res;
  if (local_1d0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_1d0.res)->refCount = (local_1d0.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_158,local_198);
  pKVar1 = local_1f0;
  std::__cxx11::string::string((string *)&local_178,"hiberlite_parent_id",(allocator *)&local_f8);
  plVar3 = (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar3 == (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    plVar3 = (pKVar1->rowId).c.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Database::dbDeleteRows<long_long>(&local_1d0,&local_158,&local_178,plVar3[-1]);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1d0);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_1b0);
  std::__cxx11::string::~string(local_198);
  return;
}

Assistant:

void KillChildren::act(AV& av, collection_nvp<E,S> nvp )
{
	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		std::vector<sqlid_t> children=Database::dbSelectChildIds(av.getConnection(), tab, rowId.top());
		for(size_t i=0;i<children.size();i++){
			E* entry;
			construct(av,&entry,static_cast<unsigned int>(0));
				rowId.push(children[i]);
					sql_nvp<E> el("item",*entry);
					av & el;
				rowId.pop();
			destroy(*this, entry, static_cast<unsigned int>(0));
		}
	av.pop();

	Database::dbDeleteRows(av.getConnection(),tab,HIBERLITE_PARENTID_COLUMN,rowId.top());
}